

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Parameters PVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Parameters *this;
  Incppect<false> *pIVar2;
  undefined8 *in_RSI;
  int in_EDI;
  string *this_00;
  Parameters parameters;
  string httpRoot;
  int port;
  undefined8 in_stack_fffffffffffffd38;
  Parameters *in_stack_fffffffffffffd40;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd48;
  function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffd50;
  iterator in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  Parameters *pPVar3;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  string *psVar4;
  string *psVar5;
  Parameters *in_stack_fffffffffffffd90;
  undefined1 *puVar6;
  undefined1 *puVar7;
  string *this_01;
  undefined1 *puVar8;
  allocator<char> *paVar9;
  allocator<char> *paVar10;
  char *local_238;
  int local_230;
  int local_22c;
  duration<long,std::ratio<1l,1000l>> local_228 [168];
  undefined1 local_180 [39];
  allocator<char> local_159;
  undefined1 local_158 [40];
  undefined1 local_130 [32];
  undefined1 *local_110;
  size_type local_108;
  string local_100 [32];
  int local_e0;
  undefined4 local_dc;
  string local_c8 [143];
  allocator<char> local_39 [37];
  int local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s [port] [httpRoot]\n",*in_RSI);
  if (local_8 < 2) {
    local_230 = 3000;
  }
  else {
    local_230 = atoi((char *)local_10[1]);
  }
  local_14 = local_230;
  if (local_8 < 3) {
    local_238 = "../examples";
  }
  else {
    local_238 = (char *)local_10[2];
  }
  paVar10 = local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::allocator<char>::~allocator(local_39);
  Incppect<false>::Parameters::Parameters(in_stack_fffffffffffffd90);
  local_e0 = local_14;
  local_dc = 0x40000;
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  this_01 = local_100;
  std::__cxx11::string::operator=(local_c8,this_01);
  std::__cxx11::string::~string(this_01);
  local_180[0x25] = 1;
  puVar8 = local_158 + 8;
  paVar9 = &local_159;
  local_158._0_8_ = puVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  puVar6 = local_130;
  puVar7 = local_180 + 0x26;
  local_158._0_8_ = puVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  local_180[0x25] = 0;
  local_110 = local_158 + 8;
  local_108 = 2;
  __l._M_len = (size_type)in_stack_fffffffffffffd60;
  __l._M_array = in_stack_fffffffffffffd58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd50,__l);
  psVar4 = (string *)(local_158 + 8);
  this_00 = (string *)&local_110;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar4);
  psVar5 = this_00;
  std::allocator<char>::~allocator((allocator<char> *)(local_180 + 0x26));
  std::allocator<char>::~allocator(&local_159);
  this = (Parameters *)Incppect<false>::getInstance();
  pPVar3 = (Parameters *)local_180;
  std::
  function<void(int,Incppect<false>::EventType,std::basic_string_view<char,std::char_traits<char>>)>
  ::function<main::__0,void>(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  Incppect<false>::handler((function *)this);
  std::
  function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1056aa);
  pIVar2 = Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(this,pPVar3);
  PVar1.tLastRequestTimeout_ms = (int64_t)in_stack_fffffffffffffd40;
  PVar1.portListen = (int)in_stack_fffffffffffffd38;
  PVar1.maxPayloadLength_bytes = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  PVar1._16_8_ = in_stack_fffffffffffffd48;
  PVar1.httpRoot._0_8_ = in_stack_fffffffffffffd50;
  PVar1.httpRoot._M_string_length = (size_type)in_stack_fffffffffffffd58;
  PVar1.httpRoot.field_2._M_allocated_capacity = (size_type)pIVar2;
  PVar1.httpRoot.field_2._8_8_ = pPVar3;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar4;
  PVar1.sslKey._0_8_ = psVar5;
  PVar1.sslKey._M_string_length = (size_type)puVar6;
  PVar1.sslKey.field_2._M_allocated_capacity = (size_type)puVar7;
  PVar1.sslKey.field_2._8_8_ = this_01;
  PVar1.sslCert._0_8_ = puVar8;
  PVar1.sslCert._M_string_length = (size_type)paVar9;
  PVar1.sslCert.field_2._M_allocated_capacity = (size_type)local_238;
  PVar1.sslCert.field_2._8_8_ = paVar10;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)0x105705);
  Incppect<false>::Parameters::~Parameters(in_stack_fffffffffffffd40);
  do {
    local_22c = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_228,&local_22c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)this);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/send";
    parameters.resources = { "", "index.html", };

    // handle input from the clients
    incppect::getInstance().handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        switch (etype) {
            case incppect::Connect:
                {
                    printf("Client %d connected\n", clientId);
                }
                break;
            case incppect::Disconnect:
                {
                    printf("Client %d disconnected\n", clientId);
                }
                break;
            case incppect::Custom:
                {
                    printf("Client %d: '%s'\n", clientId, std::string(data.data(), data.size()).c_str());
                }
                break;
        };
    });

    incppect::getInstance().runAsync(parameters).detach();

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}